

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool ELFIO::elfio::is_sect_in_seg
               (Elf64_Off sect_begin,Elf_Xword sect_size,Elf64_Off seg_begin,Elf64_Off seg_end)

{
  undefined1 local_29;
  Elf64_Off seg_end_local;
  Elf64_Off seg_begin_local;
  Elf_Xword sect_size_local;
  Elf64_Off sect_begin_local;
  
  local_29 = false;
  if ((seg_begin <= sect_begin) && (local_29 = false, sect_begin + sect_size <= seg_end)) {
    local_29 = sect_begin < seg_end;
  }
  return local_29;
}

Assistant:

static bool is_sect_in_seg( Elf64_Off sect_begin,
                                Elf_Xword sect_size,
                                Elf64_Off seg_begin,
                                Elf64_Off seg_end )
    {
        return ( seg_begin <= sect_begin ) &&
               ( sect_begin + sect_size <= seg_end ) &&
               ( sect_begin <
                 seg_end ); // this is important criteria when sect_size == 0
        // Example:  seg_begin=10, seg_end=12 (-> covering the bytes 10 and 11)
        //           sect_begin=12, sect_size=0  -> shall return false!
    }